

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVStreambuf.h
# Opt level: O1

int_type __thiscall
cmBasicUVStreambuf<char,_std::char_traits<char>_>::underflow
          (cmBasicUVStreambuf<char,_std::char_traits<char>_> *this)

{
  long lVar1;
  byte *pbVar2;
  uint uVar3;
  
  uVar3 = 0xffffffff;
  if (this->Stream != (uv_stream_t *)0x0) {
    pbVar2 = *(byte **)&this->field_0x10;
    if (*(byte **)&this->field_0x18 <= pbVar2) {
      StreamReadStartStop(this);
      while ((*(long *)&this->field_0x18 == *(long *)&this->field_0x10 &&
             (lVar1 = (**(code **)(*(long *)this + 0x38))(this), lVar1 == 0))) {
        uv_run(this->Stream->loop,UV_RUN_ONCE);
      }
      lVar1 = *(long *)&this->field_0x18 - *(long *)&this->field_0x10;
      if (lVar1 == 0) {
        lVar1 = (**(code **)(*(long *)this + 0x38))(this);
      }
      if (lVar1 == -1) {
        return -1;
      }
      pbVar2 = *(byte **)&this->field_0x10;
    }
    uVar3 = (uint)*pbVar2;
  }
  return uVar3;
}

Assistant:

typename cmBasicUVStreambuf<CharT, Traits>::int_type
cmBasicUVStreambuf<CharT, Traits>::underflow()
{
  if (!this->is_open()) {
    return Traits::eof();
  }

  if (this->gptr() < this->egptr()) {
    return Traits::to_int_type(*this->gptr());
  }

  this->StreamReadStartStop();
  while (this->in_avail() == 0) {
    uv_run(this->Stream->loop, UV_RUN_ONCE);
  }
  if (this->in_avail() == -1) {
    return Traits::eof();
  }
  return Traits::to_int_type(*this->gptr());
}